

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O2

optional<unsigned_long> __thiscall
tsbp::TwoStepBranchingProcedure::Branch(TwoStepBranchingProcedure *this,size_t nodeId)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  pointer *__args;
  uint uVar1;
  pointer psVar2;
  __uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_> _Var3;
  long lVar4;
  pointer psVar5;
  uint *puVar6;
  bool bVar7;
  size_type sVar8;
  vertex_descriptor vVar9;
  ulong uVar10;
  vec_adj_list_impl<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  _Storage<unsigned_long,_true> this_01;
  pointer psVar11;
  uint *puVar12;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar13;
  reference rVar14;
  optional<unsigned_long> oVar15;
  AdjList *g;
  vertex_descriptor leftNodeId_1;
  size_t nodeId_local;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> attemptedItemIds;
  vertex_descriptor leftNodeId;
  Status SStack_48;
  
  psVar2 = (this->tree).super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_01._M_value = nodeId * 0x30;
  if (*(Status *)((long)&psVar2[nodeId].super_StoredVertex.m_property.super_BaseNode + 8) !=
      InfeasibleSequence) {
    _Var3._M_t.
    super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>.
    super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl =
         psVar2[nodeId].super_StoredVertex.m_property.Packing._M_t.
         super___uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>
         ._M_t;
    psVar11 = *(pointer *)
               ((long)&psVar2[nodeId].super_StoredVertex.m_out_edges.
                       super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
               + 8);
    lVar4 = *(long *)&psVar2[nodeId].super_StoredVertex.m_out_edges.
                      super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
    ;
    this_00 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
              ((long)_Var3._M_t.
                     super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
                     .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl + 0x38);
    nodeId_local = nodeId;
    sVar8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(this_00);
    if ((long)psVar11 - lVar4 >> 4 != sVar8) {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&attemptedItemIds,
                 (long)(this->items).
                       super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(this->items).
                       super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl
                       .super__Vector_impl_data._M_start >> 5,0,
                 (allocator<unsigned_long> *)&leftNodeId);
      psVar2 = (this->tree).super_type.m_vertices.
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar5 = *(pointer *)
                ((long)&psVar2[nodeId].super_StoredVertex.m_out_edges.
                        super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
                + 8);
      this_01._M_value = (unsigned_long)&attemptedItemIds;
      for (psVar11 = *(pointer *)
                      &psVar2[nodeId].super_StoredVertex.m_out_edges.
                       super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
          ; psVar11 != psVar5; psVar11 = psVar11 + 1) {
        sVar8 = (size_type)
                (this->tree).super_type.m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_start
                [(psVar11->super_stored_edge<unsigned_long>).m_target].super_StoredVertex.m_property
                .super_BaseNode.ItemIdToPlace;
        if (-1 < (long)sVar8) {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)this_01,sVar8,
                     true);
        }
      }
      puVar6 = (uint *)(this->branchingOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
      for (puVar12 = (uint *)(this->branchingOrder).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start; puVar12 != puVar6;
          puVar12 = puVar12 + 1) {
        uVar1 = *puVar12;
        this_01._M_value._4_4_ = 0;
        this_01._M_value._0_4_ = uVar1;
        sVar8 = (size_type)(int)uVar1;
        bVar7 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                          ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           ((long)_Var3._M_t.
                                  super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
                                  .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>.
                                  _M_head_impl + 0x18),sVar8);
        if (!bVar7) {
          rVar14 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&attemptedItemIds,sVar8);
          if ((*rVar14.m_block & rVar14.m_mask) == 0) {
            bVar7 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                              (this_00,sVar8);
            if (bVar7) {
              vVar9 = ((long)(this->tree).super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->tree).super_type.m_vertices.
                            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x30;
              leftNodeId._4_4_ = 0;
              SStack_48 = NotEvaluated;
              leftNodeId_1 = vVar9;
              leftNodeId._0_4_ = uVar1;
              std::make_unique<tsbp::PackingRelaxed2D,tsbp::PackingRelaxed2D_const&>
                        ((PackingRelaxed2D *)&stack0xffffffffffffffc0);
              AddLeafNode(this,(Node *)&leftNodeId);
              std::unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>
              ::~unique_ptr((unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>
                             *)&stack0xffffffffffffffc0);
              boost::
              add_edge<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                        ((pair<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_bool>
                          *)&leftNodeId,(boost *)nodeId,vVar9,(vertex_descriptor)&this->tree,in_R8);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        (&this->activeNodes,&leftNodeId_1);
              uVar10 = CONCAT71((int7)((ulong)&this->activeNodes >> 8),1);
              this_01 = (_Storage<unsigned_long,_true>)leftNodeId_1;
              goto LAB_00138b6a;
            }
          }
        }
      }
      uVar10 = 0;
LAB_00138b6a:
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                (&attemptedItemIds);
      goto LAB_00138c0f;
    }
    this_01._M_value = (unsigned_long)&this->nodesToDeactivate;
    pVar13 = std::
             _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             ::_M_emplace<unsigned_long&>
                       ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                         *)this_01._M_value,&nodeId_local);
    if (*(Status *)((long)&psVar2[nodeId].super_StoredVertex.m_property.super_BaseNode + 8) == Root)
    {
      attemptedItemIds.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)attemptedItemIds.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_emplace<int>((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)this_01._M_value,&attemptedItemIds,pVar13._8_8_);
    }
    else if (*(Type *)((long)&psVar2[nodeId].super_StoredVertex.m_property.super_BaseNode + 4) !=
             DeactivatePlacement) {
      vVar9 = ((long)(this->tree).super_type.m_vertices.
                     super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->tree).super_type.m_vertices.
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x30;
      __args = &attemptedItemIds.m_bits.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      attemptedItemIds.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x1ffffffff;
      attemptedItemIds.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 2;
      leftNodeId = vVar9;
      std::make_unique<tsbp::PackingRelaxed2D,tsbp::PackingRelaxed2D_const&>
                ((PackingRelaxed2D *)__args);
      AddLeafNode(this,(Node *)&attemptedItemIds);
      std::unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>::
      ~unique_ptr((unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>
                   *)__args);
      boost::
      add_edge<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                ((pair<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_bool> *)
                 &attemptedItemIds,(boost *)nodeId_local,vVar9,(vertex_descriptor)&this->tree,in_R8)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->activeNodes,&leftNodeId);
      uVar10 = CONCAT71((int7)((ulong)&this->activeNodes >> 8),1);
      this_01 = (_Storage<unsigned_long,_true>)leftNodeId;
      goto LAB_00138c0f;
    }
  }
  uVar10 = 0;
LAB_00138c0f:
  oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar10 & 0xffffffff;
  oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = this_01._M_value;
  return (optional<unsigned_long>)
         oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> TwoStepBranchingProcedure::Branch(size_t nodeId)
{
    Node& currentNode = this->tree[nodeId];
    const boost::dynamic_bitset<>& placedItems = currentNode.PlacedItems();
    ////const std::unordered_set<size_t>& placedItems = currentNode.PlacedItems();

    if (currentNode.NodeStatus == BaseNode::Status::InfeasibleSequence)
    {
        return std::nullopt;
    }

    const PackingRelaxed2D& packing = *currentNode.Packing;

    // Determine number of outgoing edges.
    size_t numberOfOutgoingEdges = boost::out_degree(nodeId, this->tree);
    size_t numberOfRemainingItems = packing.PlaceableItemsAtCurrentX.count();
    ////size_t numberOfRemainingItems = items.size() - placedItems.count();

    // TODO.Logic: currently the DeactivatePlacement node is the last node that is generated. Rework to allow it to be explored in any sequence.
    ////bool isFixedSequenceDeactivation = numberOfOutgoingEdges == 1 && IsFixedSequence(currentNode, -1);
    ////if (numberOfOutgoingEdges == numberOfRemainingItems || isFixedSequenceDeactivation)
    if (numberOfOutgoingEdges == numberOfRemainingItems)
    {
        // AddDeactivatedPlacementNode()
        ////currentNode.Packing.ActiveX = currentNode.Packing.BackupX;
        ////currentNode.Packing.ActiveY = currentNode.Packing.BackupY;

        this->nodesToDeactivate.emplace(nodeId);

        if (currentNode.NodeStatus == BaseNode::Status::Root)
        {
            this->nodesToDeactivate.emplace(0);
            return std::nullopt;
        }

        if (currentNode.NodeType == BaseNode::Type::DeactivatePlacement)
        {
            return std::nullopt;
        }

        typename SearchTree::vertex_descriptor leftNodeId = boost::num_vertices(this->tree);
        AddLeafNode(Node{-1, BaseNode::Type::DeactivatePlacement, BaseNode::Status::NotEvaluated, std::make_unique<PackingRelaxed2D>(packing)});
        boost::add_edge(nodeId, leftNodeId, this->tree);

        // Caution, possible dangling reference to currentNode because the underlying graph might resize on AddLeafNode().
        // TODO.Performance: Consider using std::unique_ptr<Node> to reduce copy effort.

        this->activeNodes.push_back(leftNodeId);

        return leftNodeId;
    }

    typename SearchTree::out_edge_iterator outEdgeIterator;
    typename SearchTree::out_edge_iterator outEdgeEndIterator;
    typename SearchTree::edge_descriptor outEdge;

    boost::dynamic_bitset<> attemptedItemIds(items.size());

    for (boost::tie(outEdgeIterator, outEdgeEndIterator) = boost::out_edges(nodeId, this->tree); outEdgeIterator != outEdgeEndIterator; ++outEdgeIterator)
    {
        outEdge = *outEdgeIterator;
        typename SearchTree::vertex_descriptor targetId = boost::target(outEdge, this->tree);
        const Node& targetNode = this->tree[targetId];

        if (targetNode.ItemIdToPlace >= 0)
        {
            attemptedItemIds.set(targetNode.ItemIdToPlace);
        }
    }

    std::optional<size_t> newNodeId;
    // TODO.Logic: different branching logic, e.g. largest item or deliberately disable placement.
    ////for (size_t i = 0; i < items.size(); i++)
    for (int i: this->branchingOrder)
    {
        ////if (placedItems.contains(i) || attemptedItemIds[i])
        if (placedItems[i] || attemptedItemIds[i] || !packing.PlaceableItemsAtCurrentX[i])
        {
            continue;
        }

        /*
        if (!IsFixedSequence(currentNode, i))
        {
            continue;
        }
        */

        typename SearchTree::vertex_descriptor leftNodeId = boost::num_vertices(this->tree);
        AddLeafNode(Node{(int)i, BaseNode::Type::UsePlacement, BaseNode::Status::NotEvaluated, std::make_unique<PackingRelaxed2D>(packing)});
        boost::add_edge(nodeId, leftNodeId, this->tree);

        // Caution, possible dangling reference to currentNode because the underlying graph might resize on AddLeafNode().

        this->activeNodes.push_back(leftNodeId);
        newNodeId = leftNodeId;

        break;
    }

    return newNodeId;
}